

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

string * __thiscall
CLI::Formatter::make_option_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,Option *opt,bool is_positional)

{
  size_type *psVar1;
  undefined8 *puVar2;
  undefined7 in_register_00000009;
  ulong uVar3;
  stringstream out;
  string local_230;
  ulong *local_210;
  long local_208;
  ulong local_200 [2];
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0 [2];
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  (*(this->super_FormatterBase)._vptr_FormatterBase[0xc])
            (&local_1f0,this,opt,CONCAT71(in_register_00000009,is_positional) & 0xffffffff);
  (*(this->super_FormatterBase)._vptr_FormatterBase[0xd])(&local_210,this,opt);
  uVar3 = 0xf;
  if (local_1f0 != local_1e0) {
    uVar3 = local_1e0[0];
  }
  if (uVar3 < (ulong)(local_208 + local_1e8)) {
    uVar3 = 0xf;
    if (local_210 != local_200) {
      uVar3 = local_200[0];
    }
    if ((ulong)(local_208 + local_1e8) <= uVar3) {
      puVar2 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_210,0,(char *)0x0,(ulong)local_1f0);
      goto LAB_00136014;
    }
  }
  puVar2 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_210);
LAB_00136014:
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  psVar1 = puVar2 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_230.field_2._M_allocated_capacity = *psVar1;
    local_230.field_2._8_4_ = *(undefined4 *)(puVar2 + 3);
    local_230.field_2._12_4_ = *(undefined4 *)((long)puVar2 + 0x1c);
  }
  else {
    local_230.field_2._M_allocated_capacity = *psVar1;
    local_230._M_dataplus._M_p = (pointer)*puVar2;
  }
  local_230._M_string_length = puVar2[1];
  *puVar2 = psVar1;
  puVar2[1] = 0;
  *(undefined1 *)psVar1 = 0;
  (*(this->super_FormatterBase)._vptr_FormatterBase[0xe])(&local_1d0,this,opt);
  detail::format_help(local_1a0,&local_230,&local_1d0,(this->super_FormatterBase).column_width_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if (local_210 != local_200) {
    operator_delete(local_210);
  }
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  ::std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string make_option(const Option *opt, bool is_positional) const {
        std::stringstream out;
        detail::format_help(
            out, make_option_name(opt, is_positional) + make_option_opts(opt), make_option_desc(opt), column_width_);
        return out.str();
    }